

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int BlendPlane(uint8_t *src_y0,int src_stride_y0,uint8_t *src_y1,int src_stride_y1,uint8_t *alpha,
              int alpha_stride,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  undefined4 in_R11D;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(src_y0 == (uint8_t *)0x0);
  auVar6._4_4_ = -(uint)(src_y1 == (uint8_t *)0x0);
  auVar6._8_4_ = -(uint)(alpha == (uint8_t *)0x0);
  auVar6._12_4_ = -(uint)(dst_y == (uint8_t *)0x0);
  iVar4 = movmskps(in_R11D,auVar6);
  if ((height == 0 || width < 1) || iVar4 != 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = height;
    if (height < 0) {
      iVar4 = -height;
      dst_y = dst_y + ~height * dst_stride_y;
      dst_stride_y = -dst_stride_y;
    }
    if (dst_stride_y == width &&
        (alpha_stride == width && (src_stride_y1 == width && src_stride_y0 == width))) {
      width = width * iVar4;
      iVar4 = 1;
      src_stride_y0 = 0;
      src_stride_y1 = 0;
      alpha_stride = 0;
      dst_stride_y = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0x40);
    if ((width & 7U) == 0) {
      pcVar2 = BlendPlaneRow_SSSE3;
    }
    else {
      pcVar2 = BlendPlaneRow_Any_SSSE3;
    }
    if (iVar1 == 0) {
      pcVar2 = BlendPlaneRow_C;
    }
    iVar1 = libyuv::TestCpuFlag(0x400);
    if ((width & 0x1fU) == 0) {
      pcVar3 = BlendPlaneRow_AVX2;
    }
    else {
      pcVar3 = BlendPlaneRow_Any_AVX2;
    }
    if (iVar1 == 0) {
      pcVar3 = pcVar2;
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      (*pcVar3)(src_y0,src_y1,alpha,dst_y,width);
      src_y0 = src_y0 + src_stride_y0;
      src_y1 = src_y1 + src_stride_y1;
      alpha = alpha + alpha_stride;
      dst_y = dst_y + dst_stride_y;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

LIBYUV_API
int BlendPlane(const uint8_t* src_y0,
               int src_stride_y0,
               const uint8_t* src_y1,
               int src_stride_y1,
               const uint8_t* alpha,
               int alpha_stride,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  int y;
  void (*BlendPlaneRow)(const uint8_t* src0, const uint8_t* src1,
                        const uint8_t* alpha, uint8_t* dst, int width) =
      BlendPlaneRow_C;
  if (!src_y0 || !src_y1 || !alpha || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }

  // Coalesce rows for Y plane.
  if (src_stride_y0 == width && src_stride_y1 == width &&
      alpha_stride == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y0 = src_stride_y1 = alpha_stride = dst_stride_y = 0;
  }

#if defined(HAS_BLENDPLANEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    BlendPlaneRow = BlendPlaneRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      BlendPlaneRow = BlendPlaneRow_SSSE3;
    }
  }
#endif
#if defined(HAS_BLENDPLANEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    BlendPlaneRow = BlendPlaneRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      BlendPlaneRow = BlendPlaneRow_AVX2;
    }
  }
#endif
#if defined(HAS_BLENDPLANEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    BlendPlaneRow = BlendPlaneRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      BlendPlaneRow = BlendPlaneRow_MMI;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    BlendPlaneRow(src_y0, src_y1, alpha, dst_y, width);
    src_y0 += src_stride_y0;
    src_y1 += src_stride_y1;
    alpha += alpha_stride;
    dst_y += dst_stride_y;
  }
  return 0;
}